

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int i_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  float shrink_threshold;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  size_t bucket_count;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  float grow_threshold;
  size_type kSize;
  key_type *in_stack_fffffffffffffb48;
  HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb50;
  key_equal *in_stack_fffffffffffffb58;
  hasher *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  float in_stack_fffffffffffffb6c;
  float in_stack_fffffffffffffb70;
  float in_stack_fffffffffffffb74;
  float in_stack_fffffffffffffb7c;
  float type;
  AssertHelper *in_stack_fffffffffffffb80;
  float local_440;
  Message *in_stack_fffffffffffffbc8;
  float in_stack_fffffffffffffbd0;
  float in_stack_fffffffffffffbd4;
  float local_3f4;
  float local_3ec;
  value_type *in_stack_fffffffffffffc88;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc90;
  AssertionResult local_360 [2];
  hasher *local_340;
  AssertionResult local_338 [6];
  value_type local_2d0;
  key_type local_2cc;
  key_type local_2c8;
  int local_2c4;
  float local_2ac;
  AssertionResult local_2a8 [2];
  float local_284;
  undefined8 local_280;
  AssertionResult local_278;
  float local_264;
  size_type local_250;
  AssertionResult local_248 [2];
  size_type local_228;
  AssertionResult local_220 [6];
  value_type local_1b4;
  int local_1b0;
  key_type local_1ac;
  value_type local_14c;
  size_type local_148;
  float local_12c;
  undefined8 local_128;
  AssertionResult local_120 [2];
  float local_fc;
  AssertionResult local_f8;
  key_type local_e8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d8 [12];
  float local_14;
  undefined8 local_10;
  
  local_10 = 0x4098;
  for (local_14 = 0.2; local_14 <= 0.8; local_14 = local_14 + 0.2) {
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffb50,
               (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffb50,
               (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_d8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (allocator_type *)in_stack_fffffffffffffb50);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_d8);
    local_e8 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::max_load_factor((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb50,(float)((ulong)in_stack_fffffffffffffb48 >> 0x20)
                     );
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::min_load_factor((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb50,(float)((ulong)in_stack_fffffffffffffb48 >> 0x20)
                     );
    local_fc = google::
               BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::max_load_factor((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcacf35);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (char *)in_stack_fffffffffffffb60,(float *)in_stack_fffffffffffffb58,
               (float *)in_stack_fffffffffffffb50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      testing::AssertionResult::failure_message((AssertionResult *)0xcacff2);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb80,(Type)in_stack_fffffffffffffb7c,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (int)in_stack_fffffffffffffb6c,(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      testing::Message::~Message((Message *)0xcad055);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcad0c6);
    local_128 = 0;
    local_12c = google::
                BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcad0df);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (char *)in_stack_fffffffffffffb60,(double *)in_stack_fffffffffffffb58,
               (float *)in_stack_fffffffffffffb50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      testing::AssertionResult::failure_message((AssertionResult *)0xcad16f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb80,(Type)in_stack_fffffffffffffb7c,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (int)in_stack_fffffffffffffb6c,(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      testing::Message::~Message((Message *)0xcad1d2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcad243);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::resize((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
    local_148 = google::
                BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcad264);
    local_14c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffb50,
                               (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_1ac = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb50,
                            (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    local_1b0 = 2;
    while( true ) {
      local_1b4 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(in_stack_fffffffffffffb50,
                                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      sVar2 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xcad368);
      local_3ec = (float)sVar2;
      local_3f4 = (float)local_148;
      if (local_14 <= local_3ec / local_3f4) break;
      local_228 = google::
                  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcad453);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 (char *)in_stack_fffffffffffffb60,(unsigned_long *)in_stack_fffffffffffffb58,
                 (unsigned_long *)in_stack_fffffffffffffb50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb80);
        testing::AssertionResult::failure_message((AssertionResult *)0xcad4e0);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb80,(Type)in_stack_fffffffffffffb7c,
                   (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (int)in_stack_fffffffffffffb6c,(char *)in_stack_fffffffffffffb60);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   in_stack_fffffffffffffbc8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
        testing::Message::~Message((Message *)0xcad543);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcad5ae);
      local_1b0 = local_1b0 + 1;
    }
    local_250 = google::
                BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcad5d2);
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (char *)in_stack_fffffffffffffb60,(unsigned_long *)in_stack_fffffffffffffb58,
               (unsigned_long *)in_stack_fffffffffffffb50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      testing::AssertionResult::failure_message((AssertionResult *)0xcad64d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb80,(Type)in_stack_fffffffffffffb7c,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (int)in_stack_fffffffffffffb6c,(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      testing::Message::~Message((Message *)0xcad6b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcad71b);
    sVar2 = google::
            BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xcad754);
    in_stack_fffffffffffffbd0 = (float)(long)sVar2;
    in_stack_fffffffffffffbd4 = (float)sVar2;
    in_stack_fffffffffffffbc8 =
         (Message *)
         google::
         BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0xcad7c7);
    local_440 = (float)in_stack_fffffffffffffbc8;
    local_264 = (float)sVar2 / local_440 + -0.01;
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_resizing_parameters
              ((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)in_stack_fffffffffffffb50,(float)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               SUB84(in_stack_fffffffffffffb48,0));
    local_280 = 0x3ff0000000000000;
    local_284 = google::
                BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::max_load_factor((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcad876);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (char *)in_stack_fffffffffffffb60,(double *)in_stack_fffffffffffffb58,
               (float *)in_stack_fffffffffffffb50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      testing::AssertionResult::failure_message((AssertionResult *)0xcad8ee);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb80,(Type)in_stack_fffffffffffffb7c,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (int)in_stack_fffffffffffffb6c,(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      testing::Message::~Message((Message *)0xcad94b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcad9b9);
    local_2ac = google::
                BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcad9c6);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (char *)in_stack_fffffffffffffb60,(float *)in_stack_fffffffffffffb58,
               (float *)in_stack_fffffffffffffb50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      testing::AssertionResult::failure_message((AssertionResult *)0xcada50);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb80,(Type)in_stack_fffffffffffffb7c,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (int)in_stack_fffffffffffffb6c,(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      testing::Message::~Message((Message *)0xcadaad);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcadb1e);
    local_148 = google::
                BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcadb2b);
    local_2c4 = 2;
    while( true ) {
      local_2c8 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueKey(in_stack_fffffffffffffb50,
                              (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_2cc = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueKey(in_stack_fffffffffffffb50,
                              (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_2d0 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(in_stack_fffffffffffffb50,
                                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      in_stack_fffffffffffffb80 =
           (AssertHelper *)
           google::
           BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xcadc17);
      in_stack_fffffffffffffb6c = (float)in_stack_fffffffffffffb80;
      in_stack_fffffffffffffb70 = (float)(long)local_148;
      in_stack_fffffffffffffb74 = (float)local_148;
      if (in_stack_fffffffffffffb6c / in_stack_fffffffffffffb74 <= local_264) break;
      type = in_stack_fffffffffffffb6c;
      in_stack_fffffffffffffb60 =
           (hasher *)
           google::
           BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)0xcadcd4);
      local_340 = in_stack_fffffffffffffb60;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 (char *)in_stack_fffffffffffffb60,(unsigned_long *)in_stack_fffffffffffffb58,
                 (unsigned_long *)in_stack_fffffffffffffb50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_338);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb80);
        in_stack_fffffffffffffb58 =
             (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xcadd5b);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb80,(Type)type,
                   (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (int)in_stack_fffffffffffffb6c,(char *)in_stack_fffffffffffffb60);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   in_stack_fffffffffffffbc8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
        testing::Message::~Message((Message *)0xcaddb8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcade23);
      local_2c4 = local_2c4 + 1;
    }
    in_stack_fffffffffffffb7c = in_stack_fffffffffffffb6c;
    in_stack_fffffffffffffb50 =
         (HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)google::
            BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcade47);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (char *)in_stack_fffffffffffffb60,(unsigned_long *)in_stack_fffffffffffffb58,
               (unsigned_long *)in_stack_fffffffffffffb50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_360);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffb48 =
           (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0xcadebc);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb80,(Type)in_stack_fffffffffffffb7c,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (int)in_stack_fffffffffffffb6c,(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      testing::Message::~Message((Message *)0xcadf17);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcadf82);
    google::
    HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xcadfb8);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}